

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowStorageDeviceType::~IfcFlowStorageDeviceType
          (IfcFlowStorageDeviceType *this)

{
  ~IfcFlowStorageDeviceType(this);
  operator_delete(this,0x1c8);
  return;
}

Assistant:

IfcFlowStorageDeviceType() : Object("IfcFlowStorageDeviceType") {}